

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O2

int __thiscall NetQuantize::quantize_innerproduct(NetQuantize *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int _w;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  void *__ptr;
  _Base_ptr p_Var5;
  long *plVar6;
  int *piVar7;
  long *plVar8;
  ulong uVar9;
  bool bVar10;
  iterator iVar11;
  iterator iVar12;
  ulong uVar13;
  ulong uVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *this_01;
  undefined1 local_2e8 [32];
  Allocator *local_2c8;
  int local_2c0;
  int iStack_2bc;
  int iStack_2b8;
  int iStack_2b4;
  int local_2b0;
  size_type local_2a8;
  pointer local_2a0;
  _Base_ptr local_298;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_290;
  Option *local_288;
  _Base_ptr local_280;
  _Base_ptr local_278;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_270;
  Mat local_268;
  Mat local_220;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  Mat local_1c0;
  Option opt_q;
  char key [256];
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar13 = (ulong)((long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 3;
  local_270 = &this->blob_int8scale_table;
  local_278 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
  this_01 = &this->weight_int8scale_table;
  local_280 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_288 = &(this->super_ModelWriter).super_Net.opt;
  uVar14 = uVar13 & 0xffffffff;
  if ((int)uVar13 < 1) {
    uVar14 = 0;
  }
  uVar13 = 0;
  do {
    if (uVar14 == uVar13) {
      return 0;
    }
    bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar13]->type,"InnerProduct")
    ;
    if ((!bVar10) &&
       (iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&local_270->_M_t,
                        &(((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar13]->name),
       iVar11._M_node != local_278)) {
      sprintf(key,"%s_param_0",
              ((((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar13]->name)._M_dataplus._M_p);
      std::__cxx11::string::string((string *)local_2e8,key,(allocator *)&local_1c0);
      local_290 = this_01;
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
               ::find(&this_01->_M_t,(key_type *)local_2e8);
      std::__cxx11::string::~string((string *)local_2e8);
      if (iVar12._M_node == local_280) {
        fwrite("this layer need to be quantized, but no scale param!\n",0x35,1,_stderr);
        return -1;
      }
      pLVar4 = (((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar13];
      __ptr = *(void **)(iVar11._M_node + 2);
      p_Var5 = iVar11._M_node[2]._M_parent;
      local_298 = iVar11._M_node[2]._M_left;
      uVar1 = *(undefined4 *)&iVar11._M_node[2]._M_right;
      plVar6 = *(long **)(iVar11._M_node + 3);
      local_1d8 = iVar11._M_node[3]._M_parent;
      uStack_1d0 = iVar11._M_node[3]._M_left;
      uVar2 = *(undefined4 *)&iVar11._M_node[3]._M_right;
      local_2a0 = *(pointer *)(iVar11._M_node + 4);
      if (p_Var5 != (_Base_ptr)0x0) {
        LOCK();
        p_Var5->_M_color = p_Var5->_M_color + _S_black;
        UNLOCK();
      }
      local_2e8._0_8_ = *(undefined8 *)(iVar12._M_node + 2);
      local_2e8._8_8_ = iVar12._M_node[2]._M_parent;
      local_2e8._16_8_ = iVar12._M_node[2]._M_left;
      local_2e8._24_4_ = *(undefined4 *)&iVar12._M_node[2]._M_right;
      local_2c8 = *(Allocator **)(iVar12._M_node + 3);
      local_2c0 = *(int *)&iVar12._M_node[3]._M_parent;
      iStack_2bc = *(int *)((long)&iVar12._M_node[3]._M_parent + 4);
      iStack_2b8 = *(int *)&iVar12._M_node[3]._M_left;
      iStack_2b4 = *(int *)((long)&iVar12._M_node[3]._M_left + 4);
      local_2b0 = *(int *)&iVar12._M_node[3]._M_right;
      local_2a8 = *(size_type *)(iVar12._M_node + 4);
      if ((_Base_ptr)local_2e8._8_8_ != (_Base_ptr)0x0) {
        LOCK();
        ((_Base_ptr)local_2e8._8_8_)->_M_color = ((_Base_ptr)local_2e8._8_8_)->_M_color + _S_black;
        UNLOCK();
      }
      fprintf(_stderr,"quantize_innerproduct %s\n",(pLVar4->name)._M_dataplus._M_p);
      this_00 = &pLVar4[1].name.field_2;
      ncnn::Mat::reshape(&local_1c0,(Mat *)this_00,
                         *(int *)&pLVar4[1].one_blob_only / *(int *)&pLVar4[1]._vptr_Layer,
                         *(int *)&pLVar4[1]._vptr_Layer,(Allocator *)0x0);
      local_268.cstep = 0;
      local_268.data = (void *)0x0;
      local_268.refcount._0_4_ = 0;
      local_268.refcount._4_4_ = 0;
      local_268.elemsize._0_4_ = 0;
      local_268._20_8_ = 0;
      local_268.h = 0;
      local_268.d = 0;
      local_268.c = 0;
      local_268.allocator = (Allocator *)0x0;
      local_268.dims = 0;
      local_268.w = 0;
      opt_q.lightmode = local_288->lightmode;
      opt_q._1_3_ = *(undefined3 *)&local_288->field_0x1;
      opt_q.num_threads = local_288->num_threads;
      opt_q.blob_allocator = local_288->blob_allocator;
      opt_q.workspace_allocator = local_288->workspace_allocator;
      opt_q.openmp_blocktime = local_288->openmp_blocktime;
      opt_q.use_winograd_convolution = local_288->use_winograd_convolution;
      opt_q.use_sgemm_convolution = local_288->use_sgemm_convolution;
      opt_q.use_int8_inference = local_288->use_int8_inference;
      opt_q.use_vulkan_compute = local_288->use_vulkan_compute;
      uVar9._0_1_ = local_288->use_bf16_storage;
      uVar9._1_1_ = local_288->use_fp16_packed;
      uVar9._2_1_ = local_288->use_fp16_storage;
      uVar9._3_1_ = local_288->use_fp16_arithmetic;
      uVar9._4_1_ = local_288->use_int8_packed;
      uVar9._5_1_ = local_288->use_int8_storage;
      uVar9._6_1_ = local_288->use_int8_arithmetic;
      uVar9._7_1_ = local_288->use_packing_layout;
      opt_q.use_shader_pack8 = local_288->use_shader_pack8;
      opt_q.use_subgroup_basic = local_288->use_subgroup_basic;
      opt_q.use_subgroup_vote = local_288->use_subgroup_vote;
      opt_q.use_subgroup_ballot = local_288->use_subgroup_ballot;
      opt_q.use_subgroup_shuffle = local_288->use_subgroup_shuffle;
      opt_q.use_image_storage = local_288->use_image_storage;
      opt_q.use_tensor_storage = local_288->use_tensor_storage;
      opt_q.use_reserved_0 = local_288->use_reserved_0;
      opt_q.flush_denormals = local_288->flush_denormals;
      opt_q.use_local_pool_allocator = local_288->use_local_pool_allocator;
      opt_q.use_shader_local_memory = local_288->use_shader_local_memory;
      opt_q.use_cooperative_matrix = local_288->use_cooperative_matrix;
      opt_q.use_winograd23_convolution = local_288->use_winograd23_convolution;
      opt_q.use_winograd43_convolution = local_288->use_winograd43_convolution;
      opt_q.use_winograd63_convolution = local_288->use_winograd63_convolution;
      opt_q.use_a53_a55_optimized_kernel = local_288->use_a53_a55_optimized_kernel;
      opt_q.use_reserved_7 = local_288->use_reserved_7;
      opt_q.use_reserved_8 = local_288->use_reserved_8;
      opt_q.use_reserved_9 = local_288->use_reserved_9;
      opt_q.use_reserved_10 = local_288->use_reserved_10;
      opt_q.use_reserved_11 = local_288->use_reserved_11;
      opt_q._32_8_ = uVar9 & 0xffffffffffffff;
      ncnn::quantize_to_int8(&local_1c0,&local_268,(Mat *)local_2e8,&opt_q);
      bVar10 = true;
      if ((local_268.data != (void *)0x0) && ((long)local_268.c * local_268.cstep != 0)) {
        _w._0_1_ = pLVar4[1].one_blob_only;
        _w._1_1_ = pLVar4[1].support_inplace;
        _w._2_1_ = pLVar4[1].support_vulkan;
        _w._3_1_ = pLVar4[1].support_packing;
        ncnn::Mat::reshape(&local_220,&local_268,_w,(Allocator *)0x0);
        if ((Mat *)this_00 != &local_220) {
          if (local_220.refcount != (int *)0x0) {
            LOCK();
            *local_220.refcount = *local_220.refcount + 1;
            UNLOCK();
          }
          piVar7 = *(int **)((long)&pLVar4[1].name.field_2 + 8);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              plVar8 = (long *)pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
              if (plVar8 == (long *)0x0) {
                free((void *)pLVar4[1].name.field_2._M_allocated_capacity);
              }
              else {
                (**(code **)(*plVar8 + 0x18))();
              }
            }
          }
          pLVar4[1].name.field_2._M_allocated_capacity = (size_type)local_220.data;
          *(int **)((long)&pLVar4[1].name.field_2 + 8) = local_220.refcount;
          *(size_t *)
           &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data = local_220.elemsize;
          *(int *)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_220.elempack;
          pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_220.allocator;
          *(int *)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data = local_220.dims;
          *(int *)((long)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 4) = local_220.w;
          *(int *)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_220.h;
          *(int *)((long)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4) = local_220.d;
          *(int *)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage = local_220.c;
          *(size_t *)
           &pLVar4[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data = local_220.cstep;
        }
        if (local_220.refcount != (int *)0x0) {
          LOCK();
          *local_220.refcount = *local_220.refcount + -1;
          UNLOCK();
          if (*local_220.refcount == 0) {
            if (local_220.allocator == (Allocator *)0x0) {
              free(local_220.data);
            }
            else {
              (*(local_220.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bVar10 = false;
      }
      piVar7 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_268.allocator == (Allocator *)0x0) {
            free(local_268.data);
          }
          else {
            (*(local_268.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_1c0.refcount != (int *)0x0) {
        LOCK();
        *local_1c0.refcount = *local_1c0.refcount + -1;
        UNLOCK();
        if (*local_1c0.refcount == 0) {
          if (local_1c0.allocator == (Allocator *)0x0) {
            free(local_1c0.data);
          }
          else {
            (*(local_1c0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar10) {
        pLVar4[1].support_bf16_storage = true;
        pLVar4[1].support_fp16_storage = false;
        pLVar4[1].support_int8_storage = false;
        pLVar4[1].support_image_storage = false;
        if (&pLVar4[2].userdata != (void **)local_2e8) {
          if ((_Base_ptr)local_2e8._8_8_ != (_Base_ptr)0x0) {
            LOCK();
            *(_Rb_tree_color *)local_2e8._8_8_ = *(_Rb_tree_color *)local_2e8._8_8_ + _S_black;
            UNLOCK();
          }
          piVar7 = *(int **)&pLVar4[2].typeindex;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              plVar8 = (long *)pLVar4[2].type.field_2._M_allocated_capacity;
              if (plVar8 == (long *)0x0) {
                free(pLVar4[2].userdata);
              }
              else {
                (**(code **)(*plVar8 + 0x18))();
              }
            }
          }
          pLVar4[2].userdata = (void *)local_2e8._0_8_;
          *(undefined8 *)&pLVar4[2].typeindex = local_2e8._8_8_;
          pLVar4[2].type._M_dataplus._M_p = (pointer)local_2e8._16_8_;
          *(undefined4 *)&pLVar4[2].type._M_string_length = local_2e8._24_4_;
          pLVar4[2].type.field_2._M_allocated_capacity = (size_type)local_2c8;
          *(int *)((long)&pLVar4[2].type.field_2 + 8) = local_2c0;
          *(int *)((long)&pLVar4[2].type.field_2 + 0xc) = iStack_2bc;
          *(int *)&pLVar4[2].name._M_dataplus._M_p = iStack_2b8;
          *(int *)((long)&pLVar4[2].name._M_dataplus._M_p + 4) = iStack_2b4;
          *(int *)&pLVar4[2].name._M_string_length = local_2b0;
          pLVar4[2].name.field_2._M_allocated_capacity = local_2a8;
        }
        if (p_Var5 != (_Base_ptr)0x0) {
          LOCK();
          p_Var5->_M_color = p_Var5->_M_color + _S_black;
          UNLOCK();
        }
        piVar7 = pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            plVar8 = *(long **)&pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data;
            if (plVar8 == (long *)0x0) {
              free(*(void **)((long)&pLVar4[2].name.field_2 + 8));
            }
            else {
              (**(code **)(*plVar8 + 0x18))();
            }
          }
        }
        *(void **)((long)&pLVar4[2].name.field_2 + 8) = __ptr;
        *(_Base_ptr *)
         &pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data = p_Var5;
        pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_298;
        *(undefined4 *)
         &pLVar4[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = uVar1;
        *(long **)&pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data = plVar6;
        *(undefined4 *)
         &pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (undefined4)local_1d8;
        *(undefined4 *)
         ((long)&pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 4) = local_1d8._4_4_;
        *(undefined4 *)
         &pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (undefined4)uStack_1d0;
        *(undefined4 *)
         ((long)&pLVar4[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4) = uStack_1d0._4_4_;
        *(undefined4 *)
         &pLVar4[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data = uVar2;
        pLVar4[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = local_2a0;
      }
      if ((_Base_ptr)local_2e8._8_8_ != (_Base_ptr)0x0) {
        LOCK();
        *(_Rb_tree_color *)local_2e8._8_8_ = *(_Rb_tree_color *)local_2e8._8_8_ - _S_black;
        UNLOCK();
        if (*(_Rb_tree_color *)local_2e8._8_8_ == _S_red) {
          if (local_2c8 == (Allocator *)0x0) {
            free((void *)local_2e8._0_8_);
          }
          else {
            (*local_2c8->_vptr_Allocator[3])();
          }
        }
      }
      if (p_Var5 != (_Base_ptr)0x0) {
        LOCK();
        p_Var5->_M_color = p_Var5->_M_color - _S_black;
        UNLOCK();
        if (p_Var5->_M_color == _S_red) {
          if (plVar6 == (long *)0x0) {
            free(__ptr);
          }
          else {
            (**(code **)(*plVar6 + 0x18))(plVar6,__ptr);
          }
        }
      }
      this_01 = local_290;
      if (bVar10) {
        return -100;
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

int NetQuantize::quantize_innerproduct()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "InnerProduct")
            continue;

        // find InnerProduct layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // InnerProduct - quantize weight from fp32 to int8
        ncnn::InnerProduct* fc = (ncnn::InnerProduct*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_innerproduct %s\n", fc->name.c_str());

        {
            const int num_input = fc->weight_data_size / fc->num_output;

            ncnn::Mat weight_data_r2 = fc->weight_data.reshape(num_input, fc->num_output);

            ncnn::Mat weight_data_int8;
            ncnn::Option opt_q = opt;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            fc->weight_data = weight_data_int8.reshape(fc->weight_data_size);
        }

        fc->int8_scale_term = 2;
        fc->weight_data_int8_scales = weight_data_int8_scales;
        fc->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}